

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
helics::Input::getValueRef<std::vector<double,std::allocator<double>>>(Input *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  int __c;
  char *in_RDI;
  helics *this_00;
  defV *in_stack_00000010;
  DataType in_stack_0000001c;
  data_view *in_stack_00000020;
  defV val_1;
  defV val;
  vector<double,_std::allocator<double>_> out;
  data_view dv;
  Input *in_stack_00000240;
  double *in_stack_fffffffffffffef8;
  defV *in_stack_ffffffffffffff00;
  Input *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  shared_ptr<units::precise_unit> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  data_view *in_stack_ffffffffffffff28;
  Input *in_stack_ffffffffffffff30;
  data_view local_b8;
  double local_88;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  defV *in_stack_ffffffffffffffe0;
  
  pcVar3 = in_RDI;
  checkAndGetFedUpdate(in_stack_ffffffffffffff08);
  bVar1 = data_view::empty((data_view *)0x392bf6);
  if (bVar1) {
    this_00 = (helics *)(in_RDI + 0x70);
    pcVar3 = std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                      *)this_00,pcVar3,__c);
    helicsType<std::vector<double,std::allocator<double>>>(this_00);
    bVar1 = checkForNeededCoreRetrieval
                      ((size_t)pcVar3,(DataType)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (DataType)in_stack_ffffffffffffff00);
    if (bVar1) {
      forceCoreDataUpdate(in_stack_ffffffffffffff30);
    }
  }
  else {
    if (*(int *)(in_RDI + 0x54) == -1) {
      loadSourceInformation(in_stack_00000240);
    }
    if ((in_RDI[0x58] & 1U) == 0) {
      helics::valueExtract(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x392c4c);
      if (*(int *)(in_RDI + 0x54) == 1) {
        local_88 = doubleExtractAndConvert
                             ((data_view *)
                              CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18,
                              (shared_ptr<units::precise_unit> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::variant<double,void,void,double,void>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        helics::valueExtract(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x392cd0);
      }
      else if (*(int *)(in_RDI + 0x54) == 2) {
        in_stack_ffffffffffffff28 = &local_b8;
        std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)0x392d2e);
        integerExtractAndConvert
                  ((defV *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (shared_ptr<units::precise_unit> *)
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        helics::valueExtract(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x392d76);
      }
      else {
        helics::valueExtract
                  ((data_view *)
                   val.
                   super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   .
                   super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   ._M_u._24_8_,
                   val.
                   super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   .
                   super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   ._M_u._20_4_,
                   (vector<double,_std::allocator<double>_> *)
                   val.
                   super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   .
                   super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   ._M_u._8_8_);
      }
      uVar2 = changeDetected((defV *)in_stack_ffffffffffffff28,
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                             (double)in_stack_ffffffffffffff18);
      if ((bool)uVar2) {
        pvVar4 = make_valid<std::vector<double,std::allocator<double>>>(&local_50);
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)CONCAT17(uVar2,in_stack_ffffffffffffff20),pvVar4);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
  }
  pvVar4 = getValueRefImpl<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff00);
  data_view::~data_view((data_view *)0x392ecd);
  return pvVar4;
}

Assistant:

const X& Input::getValueRef()
{
    static_assert(std::is_same<typeCategory<X>, std::integral_constant<int, primaryType>>::value,
                  "calling getValue By ref must be with a primary type");
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (changeDetectionEnabled) {
            X out;
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else if (injectionType == helics::DataType::HELICS_INT) {
                defV val;
                integerExtractAndConvert(val, dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(std::move(out));
            }
        } else {
            valueExtract(dv, injectionType, lastValue);
        }
    } else {
        if (checkForNeededCoreRetrieval(lastValue.index(),
                                        injectionType,
                                        helicsType<remove_cv_ref<X>>())) {
            forceCoreDataUpdate();
        }
    }

    return getValueRefImpl<remove_cv_ref<X>>(lastValue);
}